

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_portals.cxx
# Opt level: O2

void __thiscall read_portal_v5::operator()(read_portal_v5 *this,portal_data **_portal,xr_reader *r)

{
  uint16_t *puVar1;
  portal_data *ppVar2;
  long lVar3;
  
  ppVar2 = (portal_data *)operator_new(0x50);
  (ppVar2->vertices).count = 0;
  *_portal = ppVar2;
  puVar1 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  ppVar2->sector_front = *puVar1;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 2);
  ppVar2->sector_back = puVar1[1];
  (r->field_2).m_p = (uint8_t *)(puVar1 + 4);
  (ppVar2->vertices).count = *(uint32_t *)(puVar1 + 2);
  for (lVar3 = 4; lVar3 != 0x4c; lVar3 = lVar3 + 0xc) {
    xray_re::xr_reader::r_fvector3(r,(fvector3 *)((long)(ppVar2->vertices).array + lVar3 + -4));
  }
  return;
}

Assistant:

void operator()(portal_data*& _portal, xr_reader& r) const {
	portal_data* portal = new portal_data;
	_portal = portal;
	portal->sector_front = r.r_u16();
	portal->sector_back = r.r_u16();
	portal->vertices.count = r.r_u32();
	for (uint_fast32_t i = 0; i != 6; ++i)
		r.r_fvector3(portal->vertices.array[i]);
}